

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

void __thiscall slang::parsing::ParserBase::prependSkippedTokens(ParserBase *this,Token *token)

{
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  pointer extraout_RDX;
  EVP_PKEY_CTX *src_00;
  Token *in_RSI;
  Token *in_RDI;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar3;
  Token TVar4;
  SmallVector<slang::parsing::Trivia,_8UL> buffer;
  undefined7 in_stack_fffffffffffffe78;
  TriviaKind in_stack_fffffffffffffe7f;
  SmallVectorBase<slang::parsing::Trivia> *in_stack_fffffffffffffe80;
  pointer in_stack_fffffffffffffe88;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe90;
  Token *this_00;
  Token *in_stack_fffffffffffffea0;
  pointer pTVar5;
  SmallVectorBase<slang::parsing::Trivia> local_a8 [3];
  Token *local_10;
  __extent_storage<18446744073709551615UL> _Var2;
  pointer alloc;
  
  local_10 = in_RSI;
  SmallVector<slang::parsing::Trivia,_8UL>::SmallVector
            ((SmallVector<slang::parsing::Trivia,_8UL> *)0x8d3e71);
  iVar1 = SmallVectorBase<slang::parsing::Token>::copy
                    ((SmallVectorBase<slang::parsing::Token> *)(in_RDI + 5),*(EVP_PKEY_CTX **)in_RDI
                     ,src);
  _Var2._M_extent_value = CONCAT44(extraout_var,iVar1);
  pTVar5 = extraout_RDX;
  std::span<const_slang::parsing::Token,_18446744073709551615UL>::
  span<slang::parsing::Token,_18446744073709551615UL>
            ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
             in_stack_fffffffffffffe90._M_extent_value,
             (span<slang::parsing::Token,_18446744073709551615UL> *)in_stack_fffffffffffffe88);
  tokens._M_extent._M_extent_value = in_stack_fffffffffffffe90._M_extent_value;
  tokens._M_ptr = in_stack_fffffffffffffe88;
  Trivia::Trivia((Trivia *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe7f,tokens);
  SmallVectorBase<slang::parsing::Trivia>::push_back
            (in_stack_fffffffffffffe80,
             (Trivia *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78));
  sVar3 = Token::trivia(in_stack_fffffffffffffea0);
  alloc = sVar3._M_ptr;
  SmallVectorBase<slang::parsing::Trivia>::
  append_range<std::span<const_slang::parsing::Trivia,_18446744073709551615UL>_>
            ((SmallVectorBase<slang::parsing::Trivia> *)in_stack_fffffffffffffe90._M_extent_value,
             (span<const_slang::parsing::Trivia,_18446744073709551615UL> *)in_stack_fffffffffffffe88
            );
  this_00 = local_10;
  SmallVectorBase<slang::parsing::Trivia>::copy(local_a8,*(EVP_PKEY_CTX **)in_RDI,src_00);
  std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
  span<slang::parsing::Trivia,_18446744073709551615UL>
            ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)this_00,
             (span<slang::parsing::Trivia,_18446744073709551615UL> *)in_stack_fffffffffffffe88);
  sVar3._M_extent._M_extent_value = _Var2._M_extent_value;
  sVar3._M_ptr = pTVar5;
  TVar4 = Token::withTrivia(in_RDI,(BumpAllocator *)alloc,sVar3);
  *local_10 = TVar4;
  SmallVectorBase<slang::parsing::Token>::clear
            ((SmallVectorBase<slang::parsing::Token> *)TVar4.info);
  SmallVector<slang::parsing::Trivia,_8UL>::~SmallVector
            ((SmallVector<slang::parsing::Trivia,_8UL> *)0x8d4014);
  return;
}

Assistant:

void ParserBase::prependSkippedTokens(Token& token) {
    SmallVector<Trivia, 8> buffer;
    buffer.push_back(Trivia{TriviaKind::SkippedTokens, skippedTokens.copy(alloc)});
    buffer.append_range(token.trivia());

    token = token.withTrivia(alloc, buffer.copy(alloc));
    skippedTokens.clear();
}